

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBooleanElementwiseLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  LayerCase LVar2;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  LVar2 = Specification::NeuralNetworkLayer::layer_case(layer);
  if (LVar2 == kLogicalNot) {
    validateInputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    Result::~Result(__return_storage_ptr__);
  }
  else {
    LVar2 = Specification::NeuralNetworkLayer::layer_case(layer);
    if (((LVar2 == kLogicalAnd) ||
        (LVar2 = Specification::NeuralNetworkLayer::layer_case(layer), LVar2 == kLogicalOr)) ||
       (LVar2 = Specification::NeuralNetworkLayer::layer_case(layer), LVar2 == kLogicalXor)) {
      validateInputCount(__return_storage_ptr__,layer,2,2);
      bVar1 = Result::good(__return_storage_ptr__);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
      Result::~Result(__return_storage_ptr__);
    }
    else {
      validateInputCount(__return_storage_ptr__,layer,1,2);
      bVar1 = Result::good(__return_storage_ptr__);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
      Result::~Result(__return_storage_ptr__);
    }
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    Result::~Result(__return_storage_ptr__);
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBooleanElementwiseLayer(const Specification::NeuralNetworkLayer& layer) {
    if (layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalNot) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    } else if (layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalAnd ||
               layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalOr ||
               layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalXor) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 2, 2));
    } else {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    }

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    return Result();
}